

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O0

int thread_join(thread_handle *pt)

{
  pthread_t *__s;
  int local_20;
  int local_1c;
  int ret;
  thread_priv *priv;
  thread_handle *pt_local;
  
  __s = (pthread_t *)pt->priv;
  mutex_lock((mutex_handle *)(__s + 1));
  if ((char)__s[2] == '\0') {
    local_1c = 0;
  }
  else {
    local_1c = pthread_join(*__s,(void **)0x0);
    *(undefined1 *)(__s + 2) = 0;
    if (local_1c == 0) {
      memset(__s,0,8);
    }
  }
  mutex_unlock((mutex_handle *)(__s + 1));
  if (local_1c < 1) {
    local_20 = local_1c;
  }
  else {
    local_20 = -local_1c;
  }
  return local_20;
}

Assistant:

int thread_join(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;
	int ret;

	mutex_lock(&priv->mutex);

	if (!priv->dirty) {
		ret = 0;
	} else {
		ret = pthread_join(priv->thread, NULL);

		priv->dirty = 0;

		if (ret == 0)
			memset(&priv->thread, 0x0, sizeof(priv->thread));
	}

	mutex_unlock(&priv->mutex);

	return ret > 0 ? -ret : ret;
}